

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

Promise<unsigned_long> __thiscall
kj::AsyncIoStreamWithInitialBuffer::pumpLoop
          (AsyncIoStreamWithInitialBuffer *this,AsyncOutputStream *output,uint64_t remaining,
          uint64_t total)

{
  AsyncIoStreamWithInitialBuffer *node;
  _func_int **pp_Var1;
  void *continuationTracePtr;
  anon_class_40_5_6467afc8_for_func local_70;
  uint64_t local_48;
  _func_int **local_38;
  
  pp_Var1 = output[8]._vptr_AsyncOutputStream;
  if (pp_Var1 == (_func_int **)0x0) {
    (**(code **)(*output[3]._vptr_AsyncOutputStream + 0x18))
              (&local_70.output,output[3]._vptr_AsyncOutputStream,remaining,total);
    local_70.total =
         (uint64_t)
         pumpLoop(kj::AsyncOutputStream&,unsigned_long,unsigned_long)::{lambda(auto:1)#1}::
         operator();
    kj::_::PromiseDisposer::
    appendPromise<kj::_::SimpleTransformPromiseNode<unsigned_long,kj::AsyncIoStreamWithInitialBuffer::pumpLoop(kj::AsyncOutputStream&,unsigned_long,unsigned_long)::_lambda(auto:1)_1_>,kj::_::PromiseDisposer,kj::AsyncIoStreamWithInitialBuffer::pumpLoop(kj::AsyncOutputStream&,unsigned_long,unsigned_long)::_lambda(auto:1)_1_,void*&>
              ((PromiseDisposer *)&local_70,(OwnPromiseNode *)&local_70.output,
               (anon_class_8_1_a8b0ca64_for_func *)&local_70.remaining,(void **)&local_70.total);
    node = (AsyncIoStreamWithInitialBuffer *)local_70.output;
    (this->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream =
         (_func_int **)local_70.this;
    if ((AsyncIoStreamWithInitialBuffer *)local_70.output == (AsyncIoStreamWithInitialBuffer *)0x0)
    {
      return (PromiseBase)(PromiseBase)this;
    }
    local_70.output = (AsyncOutputStream *)0x0;
  }
  else {
    if (total <= pp_Var1) {
      pp_Var1 = (_func_int **)total;
    }
    (*(code *)**(undefined8 **)remaining)
              (&local_70,remaining,output[7]._vptr_AsyncOutputStream,pp_Var1);
    local_70.total = (uint64_t)output;
    local_70.bytesToWrite = remaining;
    local_48 = total;
    local_38 = pp_Var1;
    Promise<void>::
    then<kj::AsyncIoStreamWithInitialBuffer::pumpLoop(kj::AsyncOutputStream&,unsigned_long,unsigned_long)::_lambda()_1_>
              ((Promise<void> *)this,&local_70);
    node = local_70.this;
    if (local_70.this == (AsyncIoStreamWithInitialBuffer *)0x0) {
      return (PromiseBase)(PromiseBase)this;
    }
    local_70.this = (AsyncIoStreamWithInitialBuffer *)0x0;
  }
  kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<uint64_t> pumpLoop(
      kj::AsyncOutputStream& output,
      uint64_t remaining,
      uint64_t total) {
    // If there is any data remaining in the leftover queue, we'll write it out first to output.
    if (leftover.size() > 0) {
      auto bytesToWrite = kj::min(leftover.size(), remaining);
      return output.write(leftover.first(bytesToWrite)).then(
          [this, &output, remaining, total, bytesToWrite]() mutable -> kj::Promise<uint64_t> {
        leftover = leftover.slice(bytesToWrite, leftover.size());
        // If the leftover buffer has been fully consumed, go ahead and free it now.
        if (leftover.size() == 0) {
          leftoverBackingBuffer = nullptr;
        }
        remaining -= bytesToWrite;
        total += bytesToWrite;

        if (remaining == 0) {
          return total;
        }
        return pumpLoop(output, remaining, total);
      });
    } else {
      // Otherwise, we are just going to defer to stream's pumpTo, making sure to
      // account for the total amount we've already written from the leftover queue.
      return stream->pumpTo(output, remaining).then([total](auto read) {
        return total + read;
      });
    }
  }